

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

int __thiscall
gl4cts::SparseTextureAllocationTestCase::init
          (SparseTextureAllocationTestCase *this,EVP_PKEY_CTX *ctx)

{
  reference pvVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  int local_34;
  
  pvVar2 = &this->mSupportedTargets;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  pvVar2 = &this->mFullArrayTargets;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  pvVar2 = &this->mSupportedInternalFormats;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  pvVar1 = std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_34);
  return (int)pvVar1;
}

Assistant:

void SparseTextureAllocationTestCase::init()
{
	mSupportedTargets.push_back(GL_TEXTURE_2D);
	mSupportedTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_3D);
	mSupportedTargets.push_back(GL_TEXTURE_RECTANGLE);

	mFullArrayTargets.push_back(GL_TEXTURE_1D_ARRAY);
	mFullArrayTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mFullArrayTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mFullArrayTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);

	mSupportedInternalFormats.push_back(GL_R8);
	mSupportedInternalFormats.push_back(GL_R8_SNORM);
	mSupportedInternalFormats.push_back(GL_R16);
	mSupportedInternalFormats.push_back(GL_R16_SNORM);
	mSupportedInternalFormats.push_back(GL_RG8);
	mSupportedInternalFormats.push_back(GL_RG8_SNORM);
	mSupportedInternalFormats.push_back(GL_RG16);
	mSupportedInternalFormats.push_back(GL_RG16_SNORM);
	mSupportedInternalFormats.push_back(GL_RGB565);
	mSupportedInternalFormats.push_back(GL_RGBA8);
	mSupportedInternalFormats.push_back(GL_RGBA8_SNORM);
	mSupportedInternalFormats.push_back(GL_RGB10_A2);
	mSupportedInternalFormats.push_back(GL_RGB10_A2UI);
	mSupportedInternalFormats.push_back(GL_RGBA16);
	mSupportedInternalFormats.push_back(GL_RGBA16_SNORM);
	mSupportedInternalFormats.push_back(GL_R16F);
	mSupportedInternalFormats.push_back(GL_RG16F);
	mSupportedInternalFormats.push_back(GL_RGBA16F);
	mSupportedInternalFormats.push_back(GL_R32F);
	mSupportedInternalFormats.push_back(GL_RG32F);
	mSupportedInternalFormats.push_back(GL_RGBA32F);
	mSupportedInternalFormats.push_back(GL_R11F_G11F_B10F);
	mSupportedInternalFormats.push_back(GL_RGB9_E5);
	mSupportedInternalFormats.push_back(GL_R8I);
	mSupportedInternalFormats.push_back(GL_R8UI);
	mSupportedInternalFormats.push_back(GL_R16I);
	mSupportedInternalFormats.push_back(GL_R16UI);
	mSupportedInternalFormats.push_back(GL_R32I);
	mSupportedInternalFormats.push_back(GL_R32UI);
	mSupportedInternalFormats.push_back(GL_RG8I);
	mSupportedInternalFormats.push_back(GL_RG8UI);
	mSupportedInternalFormats.push_back(GL_RG16I);
	mSupportedInternalFormats.push_back(GL_RG16UI);
	mSupportedInternalFormats.push_back(GL_RG32I);
	mSupportedInternalFormats.push_back(GL_RG32UI);
	mSupportedInternalFormats.push_back(GL_RGBA8I);
	mSupportedInternalFormats.push_back(GL_RGBA8UI);
	mSupportedInternalFormats.push_back(GL_RGBA16I);
	mSupportedInternalFormats.push_back(GL_RGBA16UI);
	mSupportedInternalFormats.push_back(GL_RGBA32I);
}